

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_FRECPE(DisasContext_conflict1 *s,arg_rr_esz *a)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      do_zz_fp(s,a,*(undefined1 **)(&DAT_01071148 + (long)a->esz * 8));
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_FRECPE(DisasContext *s, arg_rr_esz *a)
{
    static gen_helper_gvec_2_ptr * const fns[3] = {
        gen_helper_gvec_frecpe_h,
        gen_helper_gvec_frecpe_s,
        gen_helper_gvec_frecpe_d,
    };
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        do_zz_fp(s, a, fns[a->esz - 1]);
    }
    return true;
}